

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeFabricEdgeGetExp
          (ze_fabric_vertex_handle_t hVertexA,ze_fabric_vertex_handle_t hVertexB,uint32_t *pCount,
          ze_fabric_edge_handle_t *phEdges)

{
  ze_fabric_edge_handle_t p_Var1;
  bool bVar2;
  ulong local_40;
  size_t i;
  ze_pfnFabricEdgeGetExp_t pfnGetExp;
  ze_result_t result;
  ze_fabric_edge_handle_t *phEdges_local;
  uint32_t *pCount_local;
  ze_fabric_vertex_handle_t hVertexB_local;
  ze_fabric_vertex_handle_t hVertexA_local;
  
  pfnGetExp._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c778 == (code *)0x0) {
    local_40 = 0;
    while( true ) {
      bVar2 = false;
      if (phEdges != (ze_fabric_edge_handle_t *)0x0) {
        bVar2 = local_40 < *pCount;
      }
      if (!bVar2) break;
      p_Var1 = (ze_fabric_edge_handle_t)context_t::get((context_t *)&context);
      phEdges[local_40] = p_Var1;
      local_40 = local_40 + 1;
    }
  }
  else {
    pfnGetExp._4_4_ = (*DAT_0011c778)(hVertexA,hVertexB,pCount,phEdges);
  }
  return pfnGetExp._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeFabricEdgeGetExp(
        ze_fabric_vertex_handle_t hVertexA,             ///< [in] handle of first fabric vertex instance
        ze_fabric_vertex_handle_t hVertexB,             ///< [in] handle of second fabric vertex instance
        uint32_t* pCount,                               ///< [in,out] pointer to the number of fabric edges.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< total number of fabric edges available.
                                                        ///< if count is greater than the number of fabric edges available, then
                                                        ///< the driver shall update the value with the correct number of fabric
                                                        ///< edges available.
        ze_fabric_edge_handle_t* phEdges                ///< [in,out][optional][range(0, *pCount)] array of handle of fabric edges.
                                                        ///< if count is less than the number of fabric edges available, then
                                                        ///< driver shall only retrieve that number of fabric edges.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetExp = context.zeDdiTable.FabricEdgeExp.pfnGetExp;
        if( nullptr != pfnGetExp )
        {
            result = pfnGetExp( hVertexA, hVertexB, pCount, phEdges );
        }
        else
        {
            // generic implementation
            for( size_t i = 0; ( nullptr != phEdges ) && ( i < *pCount ); ++i )
                phEdges[ i ] = reinterpret_cast<ze_fabric_edge_handle_t>( context.get() );

        }

        return result;
    }